

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls_sim.c
# Opt level: O0

int IDAGetNonlinearSystemDataSens
              (void *ida_mem,sunrealtype *tcur,N_Vector **yySpred,N_Vector **ypSpred,N_Vector **yySn
              ,N_Vector **ypSn,sunrealtype *cj,void **user_data)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0xd6,"IDAGetNonlinearSystemDataSens",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_nls_sim.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x4f8);
    *in_RDX = *(undefined8 *)(in_RDI + 0x3a0);
    *in_RCX = *(undefined8 *)(in_RDI + 0x3a8);
    *in_R8 = *(undefined8 *)(in_RDI + 0x390);
    *in_R9 = *(undefined8 *)(in_RDI + 0x398);
    IDA_mem->ida_sunctx = *(SUNContext_conflict *)(in_RDI + 0x508);
    *ypSn = *(N_Vector **)(in_RDI + 0x18);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAGetNonlinearSystemDataSens(void* ida_mem, sunrealtype* tcur,
                                  N_Vector** yySpred, N_Vector** ypSpred,
                                  N_Vector** yySn, N_Vector** ypSn,
                                  sunrealtype* cj, void** user_data)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *tcur      = IDA_mem->ida_tn;
  *yySpred   = IDA_mem->ida_yySpredict;
  *ypSpred   = IDA_mem->ida_ypSpredict;
  *yySn      = IDA_mem->ida_yyS;
  *ypSn      = IDA_mem->ida_ypS;
  *cj        = IDA_mem->ida_cj;
  *user_data = IDA_mem->ida_user_data;

  return (IDA_SUCCESS);
}